

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_arange.c
# Opt level: O0

void free_aranges_chain(Dwarf_Debug dbg,Dwarf_Chain_conflict head)

{
  Dwarf_Chain pDVar1;
  int type;
  void *item;
  Dwarf_Chain_conflict next;
  Dwarf_Chain_conflict cur;
  Dwarf_Chain_conflict head_local;
  Dwarf_Debug dbg_local;
  
  pDVar1 = head;
  if (head != (Dwarf_Chain_conflict)0x0) {
    while (next = pDVar1, next != (Dwarf_Chain_conflict)0x0) {
      pDVar1 = next->ch_next;
      if ((next->ch_item != (Dwarf_Ptr)0x0) && (next->ch_itemtype != 0)) {
        dwarf_dealloc(dbg,next->ch_item,(long)next->ch_itemtype);
        next->ch_item = (void *)0x0;
        dwarf_dealloc(dbg,next,0x1f);
      }
    }
  }
  return;
}

Assistant:

static void
free_aranges_chain(Dwarf_Debug dbg, Dwarf_Chain head)
{
    Dwarf_Chain cur = head;
    Dwarf_Chain next = 0;

    if (!head) {
        return;
    }
    next = head->ch_next;
    for ( ;cur; cur = next) {
        void *item = cur->ch_item;
        int  type = cur->ch_itemtype;

        next = cur->ch_next;
        if (item && type) {
            dwarf_dealloc(dbg,item,type);
            cur->ch_item = 0;
            dwarf_dealloc(dbg,cur,DW_DLA_CHAIN);
        }
    }
}